

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseHexdigit(char c,uint32_t *out)

{
  uint32_t *out_local;
  char c_local;
  
  out_local._3_1_ = c;
  if ((int)c - 0x30U < 10) {
    *out = (int)c - 0x30;
    Result::Result((Result *)((long)&out_local + 4),Ok);
  }
  else if ((int)c - 0x61U < 7) {
    *out = (int)c - 0x57;
    Result::Result((Result *)((long)&out_local + 4),Ok);
  }
  else if ((int)c - 0x41U < 7) {
    *out = (int)c - 0x37;
    Result::Result((Result *)((long)&out_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&out_local + 4),Error);
  }
  return (Result)out_local._4_4_;
}

Assistant:

Result ParseHexdigit(char c, uint32_t* out) {
  if (static_cast<unsigned int>(c - '0') <= 9) {
    *out = c - '0';
    return Result::Ok;
  } else if (static_cast<unsigned int>(c - 'a') <= 6) {
    *out = 10 + (c - 'a');
    return Result::Ok;
  } else if (static_cast<unsigned int>(c - 'A') <= 6) {
    *out = 10 + (c - 'A');
    return Result::Ok;
  }
  return Result::Error;
}